

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O2

void panic(char *str,...)

{
  char in_AL;
  undefined8 in_RCX;
  char *pcVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list the_args;
  undefined1 local_1c8 [8];
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  char buf [256];
  
  the_args[0].reg_save_area = local_1c8;
  if (in_AL != '\0') {
    local_198 = in_XMM0_Qa;
    local_188 = in_XMM1_Qa;
    local_178 = in_XMM2_Qa;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  the_args[0].overflow_arg_area = &stack0x00000008;
  the_args[0].gp_offset = 8;
  the_args[0].fp_offset = 0x30;
  local_1c0 = in_RSI;
  local_1b8 = in_RDX;
  local_1b0 = in_RCX;
  local_1a8 = in_R8;
  local_1a0 = in_R9;
  if (program_state.panicking == 0) {
    pcVar1 = "Suddenly, the dungeon collapses.\n";
    if (program_state.something_worth_saving == 0) {
      pcVar1 = "Program initialization has failed.\n";
    }
    pcVar2 = "Postgame wrapup disrupted.\n";
    if (program_state.gameover == 0) {
      pcVar2 = pcVar1;
    }
    program_state.panicking = program_state.panicking + 1;
    (*windowprocs.win_raw_print)(pcVar2);
    if (flags.debug == '\0') {
      pcVar1 = " and it may be possible to rebuild.";
      if (program_state.something_worth_saving == 0) {
        pcVar1 = "";
      }
      raw_printf("Report error to \"%s\"%s.\n","daniel",pcVar1);
    }
    if (program_state.something_worth_saving != 0) {
      dosave0('\x01');
    }
    vsprintf(buf,str,the_args);
    (*windowprocs.win_raw_print)(buf);
    paniclog("panic",buf);
    done(0xc);
    return;
  }
  program_state.panicking = program_state.panicking + 1;
  terminate();
}

Assistant:

void panic(const char *str, ...)
{
	char buf[BUFSZ];
	va_list the_args;
	va_start(the_args, str);

	if (program_state.panicking++)
	    terminate(); /* avoid loops - this should never happen*/

	raw_print(program_state.gameover ?
		  "Postgame wrapup disrupted.\n" :
		  !program_state.something_worth_saving ?
		  "Program initialization has failed.\n" :
		  "Suddenly, the dungeon collapses.\n");
	if (!wizard)
	    raw_printf("Report error to \"%s\"%s.\n", WIZARD,
			!program_state.something_worth_saving ? "" :
			" and it may be possible to rebuild.");
	if (program_state.something_worth_saving)
	    dosave0(TRUE);
	
	vsprintf(buf,str,the_args);
	raw_print(buf);
	paniclog("panic", buf);

	va_end(the_args);
	done(PANICKED);
}